

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# move.hpp
# Opt level: O2

void __thiscall Movegen::encode_capture_promotions(Movegen *this,U64 *b,int *dir)

{
  int iVar1;
  long lVar2;
  U8 UVar3;
  ulong uVar4;
  U8 UVar5;
  
  uVar4 = *b;
  while (uVar4 != 0) {
    lVar2 = 0;
    if (uVar4 != 0) {
      for (; (uVar4 >> lVar2 & 1) == 0; lVar2 = lVar2 + 1) {
      }
    }
    uVar4 = uVar4 & uVar4 - 1;
    *b = uVar4;
    UVar3 = (U8)lVar2;
    UVar5 = (char)*dir + UVar3;
    iVar1 = this->last;
    this->list[iVar1].f = UVar5;
    this->list[iVar1].t = UVar3;
    this->list[iVar1].type = '\x04';
    this->list[(long)iVar1 + 1].f = UVar5;
    this->list[(long)iVar1 + 1].t = UVar3;
    this->list[(long)iVar1 + 1].type = '\x05';
    this->list[(long)iVar1 + 2].f = UVar5;
    this->list[(long)iVar1 + 2].t = UVar3;
    this->list[(long)iVar1 + 2].type = '\x06';
    this->last = iVar1 + 4;
    this->list[(long)iVar1 + 3].f = UVar5;
    this->list[(long)iVar1 + 3].t = UVar3;
    this->list[(long)iVar1 + 3].type = '\a';
  }
  return;
}

Assistant:

inline void Movegen::encode_capture_promotions(U64& b, const int& dir) {
	while (b) {
		Square to = Square(bits::pop_lsb(b));
		Square f = Square(to + dir);
		list[last++].set(f, to, capture_promotion_q);
		list[last++].set(f, to, capture_promotion_r);
		list[last++].set(f, to, capture_promotion_b);
		list[last++].set(f, to, capture_promotion_n);
	}
}